

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

int disas_coproc_insn(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  uint crm_00;
  uint isread_00;
  uint rt_00;
  ARMCPRegInfo_conflict *ri_00;
  TCGv_i64 pTVar6;
  TCGv_i32 pTVar7;
  TCGv_i32 pTVar8;
  TCGv_i64 arg2;
  bool bVar9;
  TCGv_i32 tcg_el;
  TCGv_i32 tmp_3;
  TCGv_ptr tmpptr_4;
  TCGv_i32 tmp_2;
  TCGv_ptr tmpptr_3;
  TCGv_i64 tmp64_1;
  TCGv_i32 tmphi;
  TCGv_i32 tmplo;
  TCGv_ptr tmpptr_2;
  TCGv_i32 tmp_1;
  TCGv_ptr tmpptr_1;
  TCGv_i32 tmp;
  TCGv_i64 tmp64;
  uint32_t syndrome;
  TCGv_i32 tcg_isread;
  TCGv_i32 tcg_syn;
  TCGv_ptr tmpptr;
  _Bool need_exit_tb;
  ARMCPRegInfo_conflict *ri;
  int rt2;
  int rt;
  int isread;
  int opc2;
  int opc1;
  int crm;
  int crn;
  int is64;
  int cpnum;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar2 = insn >> 8 & 0xf;
  iVar3 = arm_dc_feature(s,1);
  if ((iVar3 == 0) || (1 < uVar2)) {
    uVar5 = (uint)((insn & 0x2000000) == 0);
    if ((uVar5 == 0) && ((insn & 0x10) == 0)) {
      s_local._4_4_ = 1;
    }
    else {
      crm_00 = insn & 0xf;
      if (uVar5 == 0) {
        opc1 = insn >> 0x10 & 0xf;
        isread = insn >> 0x15 & 7;
        rt = insn >> 5 & 7;
        ri._4_4_ = 0;
      }
      else {
        opc1 = 0;
        isread = insn >> 4 & 0xf;
        rt = 0;
        ri._4_4_ = insn >> 0x10 & 0xf;
      }
      isread_00 = insn >> 0x14 & 1;
      rt_00 = insn >> 0xc & 0xf;
      ri_00 = get_arm_cp_reginfo_aarch64
                        (s->cp_regs,
                         (uint)(s->ns & 1) << 0x1d | uVar2 << 0x10 | uVar5 << 0xf | opc1 << 0xb |
                         crm_00 << 7 | isread << 3 | rt);
      if (ri_00 == (ARMCPRegInfo_conflict *)0x0) {
        s_local._4_4_ = 1;
      }
      else {
        _Var1 = cp_access_ok(s->current_el,ri_00,isread_00);
        if (_Var1) {
          if ((((s->hstr_active & 1U) == 0) && (ri_00->accessfn == (CPAccessFn_conflict *)0x0)) &&
             ((iVar3 = arm_dc_feature(s,1), iVar3 == 0 || (0xd < uVar2)))) {
            if ((ri_00->type & 0x8000U) != 0) {
              gen_set_condexec(s);
              gen_set_pc_im(s,s->pc_curr);
            }
          }
          else {
            if (uVar2 == 0xe) {
              if (uVar5 == 0) {
                tmp64._4_4_ = syn_cp14_rt_trap(1,0xe,isread,rt,opc1,crm_00,rt_00,isread_00,false);
              }
              else {
                tmp64._4_4_ = syn_cp14_rrt_trap(1,0xe,isread,crm_00,rt_00,ri._4_4_,isread_00,false);
              }
            }
            else if (uVar2 == 0xf) {
              if (uVar5 == 0) {
                tmp64._4_4_ = syn_cp15_rt_trap(1,0xe,isread,rt,opc1,crm_00,rt_00,isread_00,false);
              }
              else {
                tmp64._4_4_ = syn_cp15_rrt_trap(1,0xe,isread,crm_00,rt_00,ri._4_4_,isread_00,false);
              }
            }
            else {
              iVar3 = arm_dc_feature(s,0x1b);
              if (iVar3 != 0) {
                __assert_fail("!arm_dc_feature(s, ARM_FEATURE_V8)",
                              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate.c"
                              ,0x1c3d,"int disas_coproc_insn(DisasContext *, uint32_t)");
              }
              tmp64._4_4_ = syn_uncategorized();
            }
            gen_set_condexec(s);
            gen_set_pc_im(s,s->pc_curr);
            pTVar6 = tcg_const_i64_aarch64(tcg_ctx_00,(int64_t)ri_00);
            pTVar7 = tcg_const_i32_aarch64(tcg_ctx_00,tmp64._4_4_);
            pTVar8 = tcg_const_i32_aarch64(tcg_ctx_00,isread_00);
            gen_helper_access_check_cp_reg
                      (tcg_ctx_00,tcg_ctx_00->cpu_env,(TCGv_ptr)pTVar6,pTVar7,pTVar8);
            tcg_temp_free_ptr(tcg_ctx_00,(TCGv_ptr)pTVar6);
            tcg_temp_free_i32(tcg_ctx_00,pTVar7);
            tcg_temp_free_i32(tcg_ctx_00,pTVar8);
          }
          uVar2 = ri_00->type & 0xfffe0f01;
          if (uVar2 == 0x101) {
            s_local._4_4_ = 0;
          }
          else if (uVar2 == 0x201) {
            if (isread_00 == 0) {
              gen_set_pc_im(s,(s->base).pc_next);
              (s->base).is_jmp = DISAS_TARGET_2;
              s_local._4_4_ = 0;
            }
            else {
              s_local._4_4_ = 1;
            }
          }
          else {
            tb_cflags((s->base).tb);
            if (isread_00 == 0) {
              if ((ri_00->type & 2U) != 0) {
                return 0;
              }
              if (uVar5 == 0) {
                if (ri_00->writefn == (CPWriteFn_conflict *)0x0) {
                  pTVar7 = load_reg(s,rt_00);
                  store_cpu_offset(tcg_ctx_00,pTVar7,(int)ri_00->fieldoffset);
                }
                else {
                  pTVar7 = load_reg(s,rt_00);
                  pTVar6 = tcg_const_i64_aarch64(tcg_ctx_00,(int64_t)ri_00);
                  gen_helper_set_cp_reg(tcg_ctx_00,tcg_ctx_00->cpu_env,(TCGv_ptr)pTVar6,pTVar7);
                  tcg_temp_free_ptr(tcg_ctx_00,(TCGv_ptr)pTVar6);
                  tcg_temp_free_i32(tcg_ctx_00,pTVar7);
                }
              }
              else {
                pTVar6 = tcg_temp_new_i64(tcg_ctx_00);
                pTVar7 = load_reg(s,rt_00);
                pTVar8 = load_reg(s,ri._4_4_);
                tcg_gen_concat_i32_i64_aarch64(tcg_ctx_00,pTVar6,pTVar7,pTVar8);
                tcg_temp_free_i32(tcg_ctx_00,pTVar7);
                tcg_temp_free_i32(tcg_ctx_00,pTVar8);
                if (ri_00->writefn == (CPWriteFn_conflict *)0x0) {
                  tcg_gen_st_i64_aarch64(tcg_ctx_00,pTVar6,tcg_ctx_00->cpu_env,ri_00->fieldoffset);
                }
                else {
                  arg2 = tcg_const_i64_aarch64(tcg_ctx_00,(int64_t)ri_00);
                  gen_helper_set_cp_reg64(tcg_ctx_00,tcg_ctx_00->cpu_env,(TCGv_ptr)arg2,pTVar6);
                  tcg_temp_free_ptr(tcg_ctx_00,(TCGv_ptr)arg2);
                }
                tcg_temp_free_i64(tcg_ctx_00,pTVar6);
              }
            }
            else if (uVar5 == 0) {
              if ((ri_00->type & 2U) == 0) {
                if (ri_00->readfn == (CPReadFn_conflict *)0x0) {
                  tmpptr_2 = (TCGv_ptr)load_cpu_offset(tcg_ctx_00,(int)ri_00->fieldoffset);
                }
                else {
                  tmpptr_2 = (TCGv_ptr)tcg_temp_new_i32(tcg_ctx_00);
                  pTVar6 = tcg_const_i64_aarch64(tcg_ctx_00,(int64_t)ri_00);
                  gen_helper_get_cp_reg
                            (tcg_ctx_00,(TCGv_i32)tmpptr_2,tcg_ctx_00->cpu_env,(TCGv_ptr)pTVar6);
                  tcg_temp_free_ptr(tcg_ctx_00,(TCGv_ptr)pTVar6);
                }
              }
              else {
                tmpptr_2 = (TCGv_ptr)tcg_const_i32_aarch64(tcg_ctx_00,(int32_t)ri_00->resetvalue);
              }
              if (rt_00 == 0xf) {
                gen_set_cpsr(tcg_ctx_00,(TCGv_i32)tmpptr_2,0xf0000000);
                tcg_temp_free_i32(tcg_ctx_00,(TCGv_i32)tmpptr_2);
              }
              else {
                store_reg(s,rt_00,(TCGv_i32)tmpptr_2);
              }
            }
            else {
              if ((ri_00->type & 2U) == 0) {
                if (ri_00->readfn == (CPReadFn_conflict *)0x0) {
                  tmp = (TCGv_i32)tcg_temp_new_i64(tcg_ctx_00);
                  tcg_gen_ld_i64_aarch64
                            (tcg_ctx_00,(TCGv_i64)tmp,tcg_ctx_00->cpu_env,ri_00->fieldoffset);
                }
                else {
                  tmp = (TCGv_i32)tcg_temp_new_i64(tcg_ctx_00);
                  pTVar6 = tcg_const_i64_aarch64(tcg_ctx_00,(int64_t)ri_00);
                  gen_helper_get_cp_reg64
                            (tcg_ctx_00,(TCGv_i64)tmp,tcg_ctx_00->cpu_env,(TCGv_ptr)pTVar6);
                  tcg_temp_free_ptr(tcg_ctx_00,(TCGv_ptr)pTVar6);
                }
              }
              else {
                tmp = (TCGv_i32)tcg_const_i64_aarch64(tcg_ctx_00,ri_00->resetvalue);
              }
              pTVar7 = tcg_temp_new_i32(tcg_ctx_00);
              tcg_gen_extrl_i64_i32_aarch64(tcg_ctx_00,pTVar7,(TCGv_i64)tmp);
              store_reg(s,rt_00,pTVar7);
              pTVar7 = tcg_temp_new_i32(tcg_ctx_00);
              tcg_gen_extrh_i64_i32_aarch64(tcg_ctx_00,pTVar7,(TCGv_i64)tmp);
              tcg_temp_free_i64(tcg_ctx_00,(TCGv_i64)tmp);
              store_reg(s,ri._4_4_,pTVar7);
            }
            uVar4 = tb_cflags((s->base).tb);
            bVar9 = false;
            if ((uVar4 & 0x20000) != 0) {
              bVar9 = (ri_00->type & 0x40U) != 0;
            }
            if ((isread_00 == 0) && ((ri_00->type & 8U) == 0)) {
              pTVar7 = tcg_const_i32_aarch64(tcg_ctx_00,s->current_el);
              iVar3 = arm_dc_feature(s,9);
              if (iVar3 == 0) {
                if ((ri_00->type & 0x10000U) == 0) {
                  gen_helper_rebuild_hflags_a32(tcg_ctx_00,tcg_ctx_00->cpu_env,pTVar7);
                }
                else {
                  gen_helper_rebuild_hflags_a32_newel(tcg_ctx_00,tcg_ctx_00->cpu_env);
                }
              }
              else {
                gen_helper_rebuild_hflags_m32(tcg_ctx_00,tcg_ctx_00->cpu_env,pTVar7);
              }
              tcg_temp_free_i32(tcg_ctx_00,pTVar7);
              bVar9 = true;
            }
            if (bVar9) {
              gen_lookup_tb(s);
            }
            s_local._4_4_ = 0;
          }
        }
        else {
          s_local._4_4_ = 1;
        }
      }
    }
  }
  else {
    uVar4 = extract32(s->c15_cpar,uVar2,1);
    if (uVar4 == 0) {
      s_local._4_4_ = 1;
    }
    else {
      iVar3 = arm_dc_feature(s,2);
      if (iVar3 == 0) {
        iVar3 = arm_dc_feature(s,1);
        if (iVar3 == 0) {
          s_local._4_4_ = 1;
        }
        else {
          s_local._4_4_ = disas_dsp_insn(s,insn);
        }
      }
      else {
        s_local._4_4_ = disas_iwmmxt_insn(s,insn);
      }
    }
  }
  return s_local._4_4_;
}

Assistant:

static int disas_coproc_insn(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int cpnum, is64, crn, crm, opc1, opc2, isread, rt, rt2;
    const ARMCPRegInfo *ri;

    cpnum = (insn >> 8) & 0xf;

    /* First check for coprocessor space used for XScale/iwMMXt insns */
    if (arm_dc_feature(s, ARM_FEATURE_XSCALE) && (cpnum < 2)) {
        if (extract32(s->c15_cpar, cpnum, 1) == 0) {
            return 1;
        }
        if (arm_dc_feature(s, ARM_FEATURE_IWMMXT)) {
            return disas_iwmmxt_insn(s, insn);
        } else if (arm_dc_feature(s, ARM_FEATURE_XSCALE)) {
            return disas_dsp_insn(s, insn);
        }
        return 1;
    }

    /* Otherwise treat as a generic register access */
    is64 = (insn & (1 << 25)) == 0;
    if (!is64 && ((insn & (1 << 4)) == 0)) {
        /* cdp */
        return 1;
    }

    crm = insn & 0xf;
    if (is64) {
        crn = 0;
        opc1 = (insn >> 4) & 0xf;
        opc2 = 0;
        rt2 = (insn >> 16) & 0xf;
    } else {
        crn = (insn >> 16) & 0xf;
        opc1 = (insn >> 21) & 7;
        opc2 = (insn >> 5) & 7;
        rt2 = 0;
    }
    isread = (insn >> 20) & 1;
    rt = (insn >> 12) & 0xf;

    ri = get_arm_cp_reginfo(s->cp_regs,
            ENCODE_CP_REG(cpnum, is64, s->ns, crn, crm, opc1, opc2));
    if (ri) {
        bool need_exit_tb;

        /* Check access permissions */
        if (!cp_access_ok(s->current_el, ri, isread)) {
            return 1;
        }

        if (s->hstr_active || ri->accessfn ||
            (arm_dc_feature(s, ARM_FEATURE_XSCALE) && cpnum < 14)) {
            /* Emit code to perform further access permissions checks at
             * runtime; this may result in an exception.
             * Note that on XScale all cp0..c13 registers do an access check
             * call in order to handle c15_cpar.
             */
            TCGv_ptr tmpptr;
            TCGv_i32 tcg_syn, tcg_isread;
            uint32_t syndrome;

            /* Note that since we are an implementation which takes an
             * exception on a trapped conditional instruction only if the
             * instruction passes its condition code check, we can take
             * advantage of the clause in the ARM ARM that allows us to set
             * the COND field in the instruction to 0xE in all cases.
             * We could fish the actual condition out of the insn (ARM)
             * or the condexec bits (Thumb) but it isn't necessary.
             */
            switch (cpnum) {
            case 14:
                if (is64) {
                    syndrome = syn_cp14_rrt_trap(1, 0xe, opc1, crm, rt, rt2,
                                                 isread, false);
                } else {
                    syndrome = syn_cp14_rt_trap(1, 0xe, opc1, opc2, crn, crm,
                                                rt, isread, false);
                }
                break;
            case 15:
                if (is64) {
                    syndrome = syn_cp15_rrt_trap(1, 0xe, opc1, crm, rt, rt2,
                                                 isread, false);
                } else {
                    syndrome = syn_cp15_rt_trap(1, 0xe, opc1, opc2, crn, crm,
                                                rt, isread, false);
                }
                break;
            default:
                /* ARMv8 defines that only coprocessors 14 and 15 exist,
                 * so this can only happen if this is an ARMv7 or earlier CPU,
                 * in which case the syndrome information won't actually be
                 * guest visible.
                 */
                assert(!arm_dc_feature(s, ARM_FEATURE_V8));
                syndrome = syn_uncategorized();
                break;
            }

            gen_set_condexec(s);
            gen_set_pc_im(s, s->pc_curr);
            tmpptr = tcg_const_ptr(tcg_ctx, ri);
            tcg_syn = tcg_const_i32(tcg_ctx, syndrome);
            tcg_isread = tcg_const_i32(tcg_ctx, isread);
            gen_helper_access_check_cp_reg(tcg_ctx, tcg_ctx->cpu_env, tmpptr, tcg_syn,
                                           tcg_isread);
            tcg_temp_free_ptr(tcg_ctx, tmpptr);
            tcg_temp_free_i32(tcg_ctx, tcg_syn);
            tcg_temp_free_i32(tcg_ctx, tcg_isread);
        } else if (ri->type & ARM_CP_RAISES_EXC) {
            /*
             * The readfn or writefn might raise an exception;
             * synchronize the CPU state in case it does.
             */
            gen_set_condexec(s);
            gen_set_pc_im(s, s->pc_curr);
        }

        /* Handle special cases first */
        switch (ri->type & ~(ARM_CP_FLAG_MASK & ~ARM_CP_SPECIAL)) {
        case ARM_CP_NOP:
            return 0;
        case ARM_CP_WFI:
            if (isread) {
                return 1;
            }
            gen_set_pc_im(s, s->base.pc_next);
            s->base.is_jmp = DISAS_WFI;
            return 0;
        default:
            break;
        }

        if ((tb_cflags(s->base.tb) & CF_USE_ICOUNT) && (ri->type & ARM_CP_IO)) {
            // gen_io_start(tcg_ctx);
        }

        if (isread) {
            /* Read */
            if (is64) {
                TCGv_i64 tmp64;
                TCGv_i32 tmp;
                if (ri->type & ARM_CP_CONST) {
                    tmp64 = tcg_const_i64(tcg_ctx, ri->resetvalue);
                } else if (ri->readfn) {
                    TCGv_ptr tmpptr;
                    tmp64 = tcg_temp_new_i64(tcg_ctx);
                    tmpptr = tcg_const_ptr(tcg_ctx, ri);
                    gen_helper_get_cp_reg64(tcg_ctx, tmp64, tcg_ctx->cpu_env, tmpptr);
                    tcg_temp_free_ptr(tcg_ctx, tmpptr);
                } else {
                    tmp64 = tcg_temp_new_i64(tcg_ctx);
                    tcg_gen_ld_i64(tcg_ctx, tmp64, tcg_ctx->cpu_env, ri->fieldoffset);
                }
                tmp = tcg_temp_new_i32(tcg_ctx);
                tcg_gen_extrl_i64_i32(tcg_ctx, tmp, tmp64);
                store_reg(s, rt, tmp);
                tmp = tcg_temp_new_i32(tcg_ctx);
                tcg_gen_extrh_i64_i32(tcg_ctx, tmp, tmp64);
                tcg_temp_free_i64(tcg_ctx, tmp64);
                store_reg(s, rt2, tmp);
            } else {
                TCGv_i32 tmp;
                if (ri->type & ARM_CP_CONST) {
                    tmp = tcg_const_i32(tcg_ctx, ri->resetvalue);
                } else if (ri->readfn) {
                    TCGv_ptr tmpptr;
                    tmp = tcg_temp_new_i32(tcg_ctx);
                    tmpptr = tcg_const_ptr(tcg_ctx, ri);
                    gen_helper_get_cp_reg(tcg_ctx, tmp, tcg_ctx->cpu_env, tmpptr);
                    tcg_temp_free_ptr(tcg_ctx, tmpptr);
                } else {
                    tmp = load_cpu_offset(tcg_ctx, ri->fieldoffset);
                }
                if (rt == 15) {
                    /* Destination register of r15 for 32 bit loads sets
                     * the condition codes from the high 4 bits of the value
                     */
                    gen_set_nzcv(tmp);
                    tcg_temp_free_i32(tcg_ctx, tmp);
                } else {
                    store_reg(s, rt, tmp);
                }
            }
        } else {
            /* Write */
            if (ri->type & ARM_CP_CONST) {
                /* If not forbidden by access permissions, treat as WI */
                return 0;
            }

            if (is64) {
                TCGv_i32 tmplo, tmphi;
                TCGv_i64 tmp64 = tcg_temp_new_i64(tcg_ctx);
                tmplo = load_reg(s, rt);
                tmphi = load_reg(s, rt2);
                tcg_gen_concat_i32_i64(tcg_ctx, tmp64, tmplo, tmphi);
                tcg_temp_free_i32(tcg_ctx, tmplo);
                tcg_temp_free_i32(tcg_ctx, tmphi);
                if (ri->writefn) {
                    TCGv_ptr tmpptr = tcg_const_ptr(tcg_ctx, ri);
                    gen_helper_set_cp_reg64(tcg_ctx, tcg_ctx->cpu_env, tmpptr, tmp64);
                    tcg_temp_free_ptr(tcg_ctx, tmpptr);
                } else {
                    tcg_gen_st_i64(tcg_ctx, tmp64, tcg_ctx->cpu_env, ri->fieldoffset);
                }
                tcg_temp_free_i64(tcg_ctx, tmp64);
            } else {
                if (ri->writefn) {
                    TCGv_i32 tmp;
                    TCGv_ptr tmpptr;
                    tmp = load_reg(s, rt);
                    tmpptr = tcg_const_ptr(tcg_ctx, ri);
                    gen_helper_set_cp_reg(tcg_ctx, tcg_ctx->cpu_env, tmpptr, tmp);
                    tcg_temp_free_ptr(tcg_ctx, tmpptr);
                    tcg_temp_free_i32(tcg_ctx, tmp);
                } else {
                    TCGv_i32 tmp = load_reg(s, rt);
                    store_cpu_offset(tcg_ctx, tmp, ri->fieldoffset);
                }
            }
        }

        /* I/O operations must end the TB here (whether read or write) */
        need_exit_tb = ((tb_cflags(s->base.tb) & CF_USE_ICOUNT) &&
                        (ri->type & ARM_CP_IO));

        if (!isread && !(ri->type & ARM_CP_SUPPRESS_TB_END)) {
            /*
             * A write to any coprocessor register that ends a TB
             * must rebuild the hflags for the next TB.
             */
            TCGv_i32 tcg_el = tcg_const_i32(tcg_ctx, s->current_el);
            if (arm_dc_feature(s, ARM_FEATURE_M)) {
                gen_helper_rebuild_hflags_m32(tcg_ctx, tcg_ctx->cpu_env, tcg_el);
            } else {
                if (ri->type & ARM_CP_NEWEL) {
                    gen_helper_rebuild_hflags_a32_newel(tcg_ctx, tcg_ctx->cpu_env);
                } else {
                    gen_helper_rebuild_hflags_a32(tcg_ctx, tcg_ctx->cpu_env, tcg_el);
                }
            }
            tcg_temp_free_i32(tcg_ctx, tcg_el);
            /*
             * We default to ending the TB on a coprocessor register write,
             * but allow this to be suppressed by the register definition
             * (usually only necessary to work around guest bugs).
             */
            need_exit_tb = true;
        }
        if (need_exit_tb) {
            gen_lookup_tb(s);
        }

        return 0;
    }

    /* Unknown register; this might be a guest error or a QEMU
     * unimplemented feature.
     */
    if (is64) {
        qemu_log_mask(LOG_UNIMP, "%s access to unsupported AArch32 "
                      "64 bit system register cp:%d opc1: %d crm:%d "
                      "(%s)\n",
                      isread ? "read" : "write", cpnum, opc1, crm,
                      s->ns ? "non-secure" : "secure");
    } else {
        qemu_log_mask(LOG_UNIMP, "%s access to unsupported AArch32 "
                      "system register cp:%d opc1:%d crn:%d crm:%d opc2:%d "
                      "(%s)\n",
                      isread ? "read" : "write", cpnum, opc1, crn, crm, opc2,
                      s->ns ? "non-secure" : "secure");
    }

    return 1;
}